

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_splittingstep.c
# Opt level: O3

int splittingStep_FullRHS(ARKodeMem ark_mem,sunrealtype t,N_Vector y,N_Vector f,int mode)

{
  long *plVar1;
  undefined8 uVar2;
  int iVar3;
  long lVar4;
  
  plVar1 = (long *)ark_mem->step_mem;
  if (plVar1 == (long *)0x0) {
    iVar3 = -0x15;
    arkProcessError(ark_mem,-0x15,0x20,"splittingStep_FullRHS",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_splittingstep.c"
                    ,"Time step module memory is NULL.");
  }
  else {
    if (0 < (int)plVar1[3]) {
      lVar4 = 0;
      do {
        uVar2 = *(undefined8 *)(*plVar1 + lVar4 * 8);
        if (lVar4 == 0) {
          iVar3 = SUNStepper_FullRhs(t,uVar2,y,f,2);
          if (iVar3 != 0) goto LAB_0015e19d;
        }
        else {
          iVar3 = SUNStepper_FullRhs(t,uVar2,y,ark_mem->tempv1,2);
          if (iVar3 != 0) {
LAB_0015e19d:
            arkProcessError(ark_mem,-8,0xc4,"splittingStep_FullRHS",
                            "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_splittingstep.c"
                            ,
                            "At t = %.15g, the right-hand side routine failed in an unrecoverable manner."
                            ,t);
            return -8;
          }
          N_VLinearSum(0x3ff0000000000000,0,f,ark_mem->tempv1,f);
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < (int)plVar1[3]);
    }
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static int splittingStep_FullRHS(ARKodeMem ark_mem, sunrealtype t, N_Vector y,
                                 N_Vector f, SUNDIALS_MAYBE_UNUSED int mode)
{
  ARKodeSplittingStepMem step_mem = NULL;
  int retval = splittingStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return retval; }

  for (int i = 0; i < step_mem->partitions; i++)
  {
    SUNErrCode err = SUNStepper_FullRhs(step_mem->steppers[i], t, y,
                                        i == 0 ? f : ark_mem->tempv1,
                                        SUN_FULLRHS_OTHER);
    if (err != SUN_SUCCESS)
    {
      arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, __LINE__, __func__, __FILE__,
                      MSG_ARK_RHSFUNC_FAILED, t);
      return ARK_RHSFUNC_FAIL;
    }
    if (i > 0) { N_VLinearSum(ONE, f, ONE, ark_mem->tempv1, f); }
  }

  return ARK_SUCCESS;
}